

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void __thiscall DScroller::Tick(DScroller *this)

{
  EScrollPos EVar1;
  TVector2<double> *pTVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double delta;
  double height;
  double tdy;
  double tdx;
  double dy;
  double dx;
  DScroller *this_local;
  
  dy = this->m_dx;
  tdx = this->m_dy;
  dx = (double)this;
  if (this->m_Control != -1) {
    dVar3 = sector_t::CenterFloor((sector_t *)(sectors + this->m_Control));
    dVar4 = sector_t::CenterCeiling((sector_t *)(sectors + this->m_Control));
    dVar5 = (dVar3 + dVar4) - this->m_LastHeight;
    this->m_LastHeight = dVar3 + dVar4;
    dy = dVar5 * dy;
    tdx = dVar5 * tdx;
  }
  if (this->m_Accel != 0) {
    dy = this->m_vdx + dy;
    this->m_vdx = dy;
    tdx = this->m_vdy + tdx;
    this->m_vdy = tdx;
  }
  dVar3 = dy;
  if ((((dy != 0.0) || (NAN(dy))) || (tdx != 0.0)) || (NAN(tdx))) {
    switch(this->m_Type) {
    case sc_side:
      EVar1 = ::operator&(this->m_Parts,scw_top);
      if (EVar1 != 0) {
        side_t::AddTextureXOffset(sides + this->m_Affectee,0,dy);
        side_t::AddTextureYOffset(sides + this->m_Affectee,0,tdx);
      }
      EVar1 = ::operator&(this->m_Parts,scw_mid);
      if ((EVar1 != 0) &&
         (((sides[this->m_Affectee].linedef)->backsector == (sector_t_conflict *)0x0 ||
          (((sides[this->m_Affectee].linedef)->flags & 0x200000) == 0)))) {
        side_t::AddTextureXOffset(sides + this->m_Affectee,1,dy);
        side_t::AddTextureYOffset(sides + this->m_Affectee,1,tdx);
      }
      EVar1 = ::operator&(this->m_Parts,scw_bottom);
      if (EVar1 != 0) {
        side_t::AddTextureXOffset(sides + this->m_Affectee,2,dy);
        side_t::AddTextureYOffset(sides + this->m_Affectee,2,tdx);
      }
      break;
    case sc_floor:
      RotationComp(sectors + this->m_Affectee,0,dy,tdx,&tdy,&height);
      sector_t::AddXOffset((sector_t *)(sectors + this->m_Affectee),0,tdy);
      sector_t::AddYOffset((sector_t *)(sectors + this->m_Affectee),0,height);
      break;
    case sc_ceiling:
      RotationComp(sectors + this->m_Affectee,1,dy,tdx,&tdy,&height);
      sector_t::AddXOffset((sector_t *)(sectors + this->m_Affectee),1,tdy);
      sector_t::AddYOffset((sector_t *)(sectors + this->m_Affectee),1,height);
      break;
    case sc_carry:
      pTVar2 = TArray<TVector2<double>,_TVector2<double>_>::operator[]
                         (&::level.Scrolls,(long)this->m_Affectee);
      dVar4 = tdx;
      pTVar2->X = dVar3 + pTVar2->X;
      pTVar2 = TArray<TVector2<double>,_TVector2<double>_>::operator[]
                         (&::level.Scrolls,(long)this->m_Affectee);
      pTVar2->Y = dVar4 + pTVar2->Y;
      break;
    case sc_carry_ceiling:
    }
  }
  return;
}

Assistant:

void DScroller::Tick ()
{
	double dx = m_dx, dy = m_dy, tdx, tdy;

	if (m_Control != -1)
	{	// compute scroll amounts based on a sector's height changes
		double height = sectors[m_Control].CenterFloor () +
						 sectors[m_Control].CenterCeiling ();
		double delta = height - m_LastHeight;
		m_LastHeight = height;
		dx *= delta;
		dy *= delta;
	}

	// killough 3/14/98: Add acceleration
	if (m_Accel)
	{
		m_vdx = dx += m_vdx;
		m_vdy = dy += m_vdy;
	}

	if (dx == 0 && dy == 0)
		return;

	switch (m_Type)
	{
		case EScroll::sc_side:					// killough 3/7/98: Scroll wall texture
			if (m_Parts & EScrollPos::scw_top)
			{
				sides[m_Affectee].AddTextureXOffset(side_t::top, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::top, dy);
			}
			if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
				!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
			{
				sides[m_Affectee].AddTextureXOffset(side_t::mid, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::mid, dy);
			}
			if (m_Parts & EScrollPos::scw_bottom)
			{
				sides[m_Affectee].AddTextureXOffset(side_t::bottom, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::bottom, dy);
			}
			break;

		case EScroll::sc_floor:						// killough 3/7/98: Scroll floor texture
			RotationComp(&sectors[m_Affectee], sector_t::floor, dx, dy, tdx, tdy);
			sectors[m_Affectee].AddXOffset(sector_t::floor, tdx);
			sectors[m_Affectee].AddYOffset(sector_t::floor, tdy);
			break;

		case EScroll::sc_ceiling:					// killough 3/7/98: Scroll ceiling texture
			RotationComp(&sectors[m_Affectee], sector_t::ceiling, dx, dy, tdx, tdy);
			sectors[m_Affectee].AddXOffset(sector_t::ceiling, tdx);
			sectors[m_Affectee].AddYOffset(sector_t::ceiling, tdy);
			break;

		// [RH] Don't actually carry anything here. That happens later.
		case EScroll::sc_carry:
			level.Scrolls[m_Affectee].X += dx;
			level.Scrolls[m_Affectee].Y += dy;
			break;

		case EScroll::sc_carry_ceiling:       // to be added later
			break;
	}
}